

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O1

FilePath *
testing::internal::FilePath::ConcatPaths
          (FilePath *__return_storage_ptr__,FilePath *directory,FilePath *relative_path)

{
  pointer pcVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  undefined1 local_88 [8];
  FilePath dir;
  __string_type __str;
  long local_38;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  if ((directory->pathname_)._M_string_length == 0) {
    (__return_storage_ptr__->pathname_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->pathname_).field_2;
    pcVar1 = (relative_path->pathname_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,
               pcVar1 + (relative_path->pathname_)._M_string_length);
  }
  else {
    RemoveTrailingPathSeparator((FilePath *)local_88,directory);
    dir.pathname_.field_2._8_8_ = &__str._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)&dir.pathname_.field_2 + 8),local_88,
               dir.pathname_._M_dataplus._M_p + (long)local_88);
    std::__cxx11::string::_M_replace_aux
              ((ulong)((long)&dir.pathname_.field_2 + 8),(ulong)__str._M_dataplus._M_p,0,'\x01');
    plVar3 = (long *)std::__cxx11::string::_M_append
                               (dir.pathname_.field_2._M_local_buf + 8,
                                (ulong)(relative_path->pathname_)._M_dataplus._M_p);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_38 = *plVar4;
      uStack_30 = (undefined4)plVar3[3];
      uStack_2c = *(undefined4 *)((long)plVar3 + 0x1c);
      __str.field_2._8_8_ = &local_38;
    }
    else {
      local_38 = *plVar4;
      __str.field_2._8_8_ = (long *)*plVar3;
    }
    lVar2 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    (__return_storage_ptr__->pathname_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->pathname_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,__str.field_2._8_8_,lVar2 + __str.field_2._8_8_);
    Normalize(__return_storage_ptr__);
    if ((long *)__str.field_2._8_8_ != &local_38) {
      operator_delete((void *)__str.field_2._8_8_);
    }
    if ((size_type *)dir.pathname_.field_2._8_8_ != &__str._M_string_length) {
      operator_delete((void *)dir.pathname_.field_2._8_8_);
    }
    if (local_88 != (undefined1  [8])&dir.pathname_._M_string_length) {
      operator_delete((void *)local_88);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::ConcatPaths(const FilePath& directory,
                               const FilePath& relative_path) {
  if (directory.IsEmpty())
    return relative_path;
  const FilePath dir(directory.RemoveTrailingPathSeparator());
  return FilePath(dir.string() + kPathSeparator + relative_path.string());
}